

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManWriter.cpp
# Opt level: O1

void __thiscall adios2::core::engine::DataManWriter::Handshake(DataManWriter *this)

{
  value_t vVar1;
  json_value jVar2;
  bool bVar3;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *this_00;
  int iVar4;
  long lVar5;
  reference pvVar6;
  long *plVar7;
  long *plVar8;
  ZmqReqRep *this_01;
  int iVar9;
  string js;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> request;
  string r;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_c0;
  long *local_b0;
  size_t local_a8;
  long local_a0;
  long lStack_98;
  ZmqReqRep *local_90;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_88;
  long *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  char *local_70 [2];
  char local_60 [16];
  string_t local_50;
  
  this_01 = &this->m_Replier;
  local_88 = &this->m_HandshakeJson;
  iVar9 = 0;
  local_90 = this_01;
  do {
    zmq::ZmqReqRep::ReceiveRequest((ZmqReqRep *)&local_80);
    bVar3 = true;
    if ((local_80 != (long *)0x0) && (local_80[1] != *local_80)) {
      local_70[0] = local_60;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                ((string *)local_70,*local_80,local_80[1]);
      iVar4 = std::__cxx11::string::compare((char *)local_70);
      this_00 = local_88;
      if (iVar4 == 0) {
        lVar5 = std::chrono::_V2::system_clock::now();
        local_c0.m_type = null;
        local_c0.m_value.object = (object_t *)0x0;
        nlohmann::detail::external_constructor<(nlohmann::detail::value_t)5>::
        construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (&local_c0,lVar5 / 1000000);
        pvVar6 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)this_00,"TimeStamp");
        vVar1 = pvVar6->m_type;
        pvVar6->m_type = local_c0.m_type;
        jVar2 = pvVar6->m_value;
        (pvVar6->m_value).object = (object_t *)local_c0.m_value;
        local_c0.m_type = vVar1;
        local_c0.m_value = jVar2;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&local_c0);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::dump(&local_50,this_00,-1,' ',false,strict);
        plVar7 = (long *)std::__cxx11::string::_M_replace_aux
                                   ((ulong)&local_50,local_50._M_string_length,0,'\x01');
        local_b0 = &local_a0;
        plVar8 = plVar7 + 2;
        if ((long *)*plVar7 == plVar8) {
          local_a0 = *plVar8;
          lStack_98 = plVar7[3];
        }
        else {
          local_a0 = *plVar8;
          local_b0 = (long *)*plVar7;
        }
        local_a8 = plVar7[1];
        *plVar7 = (long)plVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        this_01 = local_90;
        zmq::ZmqReqRep::SendReply(local_90,local_b0,local_a8);
        if (local_b0 != &local_a0) {
          operator_delete(local_b0);
        }
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)local_70);
        if (iVar4 == 0) {
          zmq::ZmqReqRep::SendReply(this_01,"OK",2);
          iVar9 = iVar9 + 1;
        }
      }
      bVar3 = iVar9 < this->m_RendezvousReaderCount;
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
    }
    if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
    }
  } while (bVar3);
  return;
}

Assistant:

void DataManWriter::Handshake()
{
    int readerCount = 0;
    while (true)
    {
        auto request = m_Replier.ReceiveRequest();
        if (request != nullptr && request->size() > 0)
        {
            std::string r(request->begin(), request->end());
            if (r == "Handshake")
            {
                m_HandshakeJson["TimeStamp"] =
                    std::chrono::duration_cast<std::chrono::milliseconds>(
                        std::chrono::system_clock::now().time_since_epoch())
                        .count();
                std::string js = m_HandshakeJson.dump() + '\0';
                m_Replier.SendReply(js.data(), js.size());
            }
            else if (r == "Ready")
            {
                m_Replier.SendReply("OK", 2);
                ++readerCount;
            }

            if (readerCount >= m_RendezvousReaderCount)
            {
                break;
            }
        }
    }
}